

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread_test.cpp
# Opt level: O3

pint p_test_case_puthread_general_test(void)

{
  int iVar1;
  P_HANDLE pvVar2;
  PUThread *pPVar3;
  PUThread *pPVar4;
  long lVar5;
  undefined8 uVar6;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  thread_wakes_1 = 1;
  thread_wakes_2 = 2;
  thread1_id = (P_HANDLE)0x0;
  thread2_id = (P_HANDLE)0x0;
  thread1_obj = (PUThread *)0x0;
  thread2_obj = (PUThread *)0x0;
  tls_key = (PUThreadKey *)p_uthread_local_new(0);
  if (tls_key == (PUThreadKey *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
           ,0x114);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pvVar2 = (P_HANDLE)p_uthread_current_id();
  is_threads_working = 1;
  pPVar3 = (PUThread *)
           p_uthread_create_full(test_thread_func,&thread_wakes_1,1,4,0x10000,"thread_name");
  pPVar4 = (PUThread *)
           p_uthread_create_full
                     (test_thread_func,&thread_wakes_2,1,4,0x10000,
                      "very_long_name_for_thread_testing");
  p_uthread_ref(pPVar3);
  p_uthread_set_priority(pPVar3,4);
  if (pPVar3 == (PUThread *)0x0) {
    uVar6 = 0x12f;
  }
  else if (pPVar4 == (PUThread *)0x0) {
    uVar6 = 0x130;
  }
  else {
    p_uthread_sleep(5000);
    is_threads_working = 0;
    iVar1 = p_uthread_join(pPVar3);
    if (iVar1 != thread_wakes_1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
             ,0x136);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar1 = p_uthread_join(pPVar4);
    if (iVar1 != thread_wakes_2) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
             ,0x137);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    if (thread1_id != thread2_id) {
      if (thread1_id == pvVar2 || thread2_id == pvVar2) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
               ,0x13a);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if (thread1_obj != pPVar3) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
               ,0x13c);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      if (thread2_obj != pPVar4) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
               ,0x13d);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      p_uthread_local_free(tls_key);
      p_uthread_unref(pPVar3);
      p_uthread_unref(pPVar4);
      p_uthread_unref(pPVar3);
      lVar5 = p_uthread_current();
      if (lVar5 == 0) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
               ,0x146);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      iVar1 = p_uthread_ideal_count();
      if (iVar1 < 1) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
               ,0x148);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
      p_libsys_shutdown();
      return -(uint)(p_test_module_fail_counter != 0);
    }
    uVar6 = 0x139;
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/puthread_test.cpp"
         ,uVar6);
  exit(-1);
}

Assistant:

P_TEST_CASE_BEGIN (puthread_general_test)
{
	p_libsys_init ();

	thread_wakes_1 = 1;
	thread_wakes_2 = 2;
	thread1_id     = (P_HANDLE) NULL;
	thread2_id     = (P_HANDLE) NULL;
	thread1_obj    = NULL;
	thread2_obj    = NULL;

	tls_key = p_uthread_local_new (NULL);
	P_TEST_CHECK (tls_key != NULL);

	/* Threre is no guarantee that we wouldn't get one of the IDs
	 * of the finished test threads */

	P_HANDLE main_id = p_uthread_current_id ();

	is_threads_working = TRUE;

	PUThread *thr1 = p_uthread_create_full ((PUThreadFunc) test_thread_func,
						(ppointer) &thread_wakes_1,
						TRUE,
						P_UTHREAD_PRIORITY_NORMAL,
						64 * 1024,
						"thread_name");

	PUThread *thr2 = p_uthread_create_full ((PUThreadFunc) test_thread_func,
						(ppointer) &thread_wakes_2,
						TRUE,
						P_UTHREAD_PRIORITY_NORMAL,
						64 * 1024,
						"very_long_name_for_thread_testing");

	p_uthread_ref (thr1);

	p_uthread_set_priority (thr1, P_UTHREAD_PRIORITY_NORMAL);

	P_TEST_REQUIRE (thr1 != NULL);
	P_TEST_REQUIRE (thr2 != NULL);

	p_uthread_sleep (5000);

	is_threads_working = FALSE;

	P_TEST_CHECK (p_uthread_join (thr1) == thread_wakes_1);
	P_TEST_CHECK (p_uthread_join (thr2) == thread_wakes_2);

	P_TEST_REQUIRE (thread1_id != thread2_id);
	P_TEST_CHECK (thread1_id != main_id && thread2_id != main_id);

	P_TEST_CHECK (thread1_obj == thr1);
	P_TEST_CHECK (thread2_obj == thr2);

	p_uthread_local_free (tls_key);
	p_uthread_unref (thr1);
	p_uthread_unref (thr2);

	p_uthread_unref (thr1);

	PUThread *cur_thr = p_uthread_current ();
	P_TEST_CHECK (cur_thr != NULL);

	P_TEST_CHECK (p_uthread_ideal_count () > 0);

	p_libsys_shutdown ();
}